

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  char cVar1;
  uint local_4c;
  uint local_38;
  uint local_34;
  int local_30;
  int open;
  int nAtts;
  anon_enum_32 state;
  ATTRIBUTE *atts_local;
  char *pcStack_18;
  int attsMax_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  open = 1;
  local_30 = 0;
  local_34 = 0;
  pcStack_18 = ptr + 2;
  do {
    if (*pcStack_18 == '\0') {
      local_38 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)pcStack_18[1]);
    }
    else {
      local_38 = unicode_byte_type(*pcStack_18,pcStack_18[1]);
    }
    switch(local_38) {
    case 3:
      if (local_30 < attsMax) {
        atts[local_30].normalized = '\0';
      }
      break;
    default:
      break;
    case 5:
      if (open == 0) {
        if (local_30 < attsMax) {
          atts[local_30].name = pcStack_18;
          atts[local_30].normalized = '\x01';
        }
        open = 1;
      }
      break;
    case 6:
      if (open == 0) {
        if (local_30 < attsMax) {
          atts[local_30].name = pcStack_18;
          atts[local_30].normalized = '\x01';
        }
        open = 1;
      }
      pcStack_18 = pcStack_18 + 1;
      break;
    case 7:
      if (open == 0) {
        if (local_30 < attsMax) {
          atts[local_30].name = pcStack_18;
          atts[local_30].normalized = '\x01';
        }
        open = 1;
      }
      pcStack_18 = pcStack_18 + 2;
      break;
    case 9:
    case 10:
      if (open == 1) {
        open = 0;
      }
      else if ((open == 2) && (local_30 < attsMax)) {
        atts[local_30].normalized = '\0';
      }
      break;
    case 0xb:
    case 0x11:
      if (open != 2) {
        return local_30;
      }
      break;
    case 0xc:
      if (open == 2) {
        if (local_34 == 0xc) {
          open = 0;
          if (local_30 < attsMax) {
            atts[local_30].valueEnd = pcStack_18;
          }
          local_30 = local_30 + 1;
        }
      }
      else {
        if (local_30 < attsMax) {
          atts[local_30].valuePtr = pcStack_18 + 2;
        }
        open = 2;
        local_34 = 0xc;
      }
      break;
    case 0xd:
      if (open == 2) {
        if (local_34 == 0xd) {
          open = 0;
          if (local_30 < attsMax) {
            atts[local_30].valueEnd = pcStack_18;
          }
          local_30 = local_30 + 1;
        }
      }
      else {
        if (local_30 < attsMax) {
          atts[local_30].valuePtr = pcStack_18 + 2;
        }
        open = 2;
        local_34 = 0xd;
      }
      break;
    case 0x15:
      if (open == 1) {
        open = 0;
      }
      else if (((open == 2) && (local_30 < attsMax)) && (atts[local_30].normalized != '\0')) {
        if (pcStack_18 != atts[local_30].valuePtr) {
          if (*pcStack_18 == '\0') {
            cVar1 = pcStack_18[1];
          }
          else {
            cVar1 = -1;
          }
          if (cVar1 == ' ') {
            if (pcStack_18[2] == '\0') {
              cVar1 = pcStack_18[3];
            }
            else {
              cVar1 = -1;
            }
            if (cVar1 != ' ') {
              if (pcStack_18[2] == '\0') {
                local_4c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)pcStack_18[3]);
              }
              else {
                local_4c = unicode_byte_type(pcStack_18[2],pcStack_18[3]);
              }
              if (local_4c != local_34) break;
            }
          }
        }
        atts[local_30].normalized = '\0';
      }
      break;
    case 0x16:
    case 0x18:
    case 0x1d:
      if (open == 0) {
        if (local_30 < attsMax) {
          atts[local_30].name = pcStack_18;
          atts[local_30].normalized = '\x01';
        }
        open = 1;
      }
    }
    pcStack_18 = pcStack_18 + 2;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr, int attsMax,
                ATTRIBUTE *atts) {
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define START_NAME                                                           \
    if (state == other) {                                                      \
      if (nAtts < attsMax) {                                                   \
        atts[nAtts].name = ptr;                                                \
        atts[nAtts].normalized = 1;                                            \
      }                                                                        \
      state = inName;                                                          \
    }
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n: /* NOTE: The encoding has already been validated. */        \
    START_NAME ptr += (n - MINBPC(enc));                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#  undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      } else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      } else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR:
    case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}